

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusIntersect.cpp
# Opt level: O1

bool ParseLocusIntersect(string *sLine1,string *sLine2,string *sLine3)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  size_type sVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  string sTestId;
  string sIntersection1Lat;
  string sIntersection1Long;
  LLPoint intersection;
  string sPtIntLon;
  string sPtIntLat;
  double local_610;
  string sLocus2EndLong;
  string sLocus2EndLat;
  string sLocus2StartLong;
  string sLocus2StartLat;
  string sLocus2GeoEndLong;
  string sLocus2GeoEndLat;
  string sLocus2GeoStartLong;
  string sLocus2GeoStartLat;
  string sLocus1EndLong;
  string sLocus1EndLat;
  string sLocus1StartLong;
  string sLocus1StartLat;
  string sLocus1GeoEndLong;
  string sLocus1GeoEndLat;
  string sLocus1GeoStartLong;
  string sLocus1GeoStartLat;
  string sLocus2EndDist;
  string sLocus2StartDist;
  string sLocus1EndDist;
  string sLocus1StartDist;
  Locus locus1;
  Locus locus2;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  sLocus1GeoStartLat._M_dataplus._M_p = (pointer)&sLocus1GeoStartLat.field_2;
  sLocus1GeoStartLat._M_string_length = 0;
  sLocus1GeoStartLat.field_2._M_local_buf[0] = '\0';
  sLocus1GeoStartLong._M_dataplus._M_p = (pointer)&sLocus1GeoStartLong.field_2;
  sLocus1GeoStartLong._M_string_length = 0;
  sLocus1GeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocus1GeoEndLat._M_dataplus._M_p = (pointer)&sLocus1GeoEndLat.field_2;
  sLocus1GeoEndLat._M_string_length = 0;
  sLocus1GeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocus1GeoEndLong._M_dataplus._M_p = (pointer)&sLocus1GeoEndLong.field_2;
  sLocus1GeoEndLong._M_string_length = 0;
  sLocus1GeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocus1StartLat._M_dataplus._M_p = (pointer)&sLocus1StartLat.field_2;
  sLocus1StartLat._M_string_length = 0;
  sLocus1StartLat.field_2._M_local_buf[0] = '\0';
  sLocus1StartLong._M_dataplus._M_p = (pointer)&sLocus1StartLong.field_2;
  sLocus1StartLong._M_string_length = 0;
  sLocus1StartLong.field_2._M_local_buf[0] = '\0';
  sLocus1EndLat._M_dataplus._M_p = (pointer)&sLocus1EndLat.field_2;
  sLocus1EndLat._M_string_length = 0;
  sLocus1EndLat.field_2._M_local_buf[0] = '\0';
  sLocus1EndLong._M_dataplus._M_p = (pointer)&sLocus1EndLong.field_2;
  sLocus1EndLong._M_string_length = 0;
  sLocus1EndLong.field_2._M_local_buf[0] = '\0';
  sLocus1StartDist._M_dataplus._M_p = (pointer)&sLocus1StartDist.field_2;
  sLocus1StartDist._M_string_length = 0;
  sLocus1StartDist.field_2._M_local_buf[0] = '\0';
  sLocus1EndDist._M_dataplus._M_p = (pointer)&sLocus1EndDist.field_2;
  sLocus1EndDist._M_string_length = 0;
  sLocus1EndDist.field_2._M_local_buf[0] = '\0';
  sLocus2GeoStartLat._M_dataplus._M_p = (pointer)&sLocus2GeoStartLat.field_2;
  sLocus2GeoStartLat._M_string_length = 0;
  sLocus2GeoStartLat.field_2._M_local_buf[0] = '\0';
  sLocus2GeoStartLong._M_dataplus._M_p = (pointer)&sLocus2GeoStartLong.field_2;
  sLocus2GeoStartLong._M_string_length = 0;
  sLocus2GeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocus2GeoEndLat._M_dataplus._M_p = (pointer)&sLocus2GeoEndLat.field_2;
  sLocus2GeoEndLat._M_string_length = 0;
  sLocus2GeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocus2GeoEndLong._M_dataplus._M_p = (pointer)&sLocus2GeoEndLong.field_2;
  sLocus2GeoEndLong._M_string_length = 0;
  sLocus2GeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocus2StartLat._M_dataplus._M_p = (pointer)&sLocus2StartLat.field_2;
  sLocus2StartLat._M_string_length = 0;
  sLocus2StartLat.field_2._M_local_buf[0] = '\0';
  sLocus2StartLong._M_dataplus._M_p = (pointer)&sLocus2StartLong.field_2;
  sLocus2StartLong._M_string_length = 0;
  sLocus2StartLong.field_2._M_local_buf[0] = '\0';
  sLocus2EndLat._M_dataplus._M_p = (pointer)&sLocus2EndLat.field_2;
  sLocus2EndLat._M_string_length = 0;
  sLocus2EndLat.field_2._M_local_buf[0] = '\0';
  sLocus2EndLong._M_dataplus._M_p = (pointer)&sLocus2EndLong.field_2;
  sLocus2EndLong._M_string_length = 0;
  sLocus2EndLong.field_2._M_local_buf[0] = '\0';
  sLocus2StartDist._M_dataplus._M_p = (pointer)&sLocus2StartDist.field_2;
  sLocus2StartDist._M_string_length = 0;
  sLocus2StartDist.field_2._M_local_buf[0] = '\0';
  sLocus2EndDist._M_dataplus._M_p = (pointer)&sLocus2EndDist.field_2;
  sLocus2EndDist._M_string_length = 0;
  sLocus2EndDist.field_2._M_local_buf[0] = '\0';
  sIntersection1Lat._M_dataplus._M_p = (pointer)&sIntersection1Lat.field_2;
  sIntersection1Lat._M_string_length = 0;
  sIntersection1Lat.field_2._M_local_buf[0] = '\0';
  sIntersection1Long._M_dataplus._M_p = (pointer)&sIntersection1Long.field_2;
  sIntersection1Long._M_string_length = 0;
  sIntersection1Long.field_2._M_local_buf[0] = '\0';
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  pcVar1 = (sLine1->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + sLine1->_M_string_length);
  bVar4 = ParseLocusIntersect1
                    (&local_50,&sTestId,&sLocus1GeoStartLat,&sLocus1GeoStartLong,&sLocus1GeoEndLat,
                     &sLocus1GeoEndLong,&sLocus1StartLat,&sLocus1StartLong,&sLocus1EndLat,
                     &sLocus1EndLong,&sLocus1StartDist,&sLocus1EndDist);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (bVar4) {
    pcVar1 = (sLine2->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + sLine2->_M_string_length);
    bVar4 = ParseLocusIntersect2
                      (&local_70,&sLocus2GeoStartLat,&sLocus2GeoStartLong,&sLocus2GeoEndLat,
                       &sLocus2GeoEndLong,&sLocus2StartLat,&sLocus2StartLong,&sLocus2EndLat,
                       &sLocus2EndLong,&sLocus2StartDist,&sLocus2EndDist);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (bVar4) {
      pcVar1 = (sLine3->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + sLine3->_M_string_length);
      bVar4 = ParseLocusIntersect3(&local_90,&sIntersection1Lat,&sIntersection1Long);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      bVar8 = false;
      if (!bVar4) goto LAB_001444ad;
      locus1.lineType = 0;
      locus1.startDist = 0.0;
      locus1.endDist = 0.0;
      locus1.locusEnd.latitude = 0.0;
      locus1.locusEnd.longitude = 0.0;
      locus1.locusStart.latitude = 0.0;
      locus1.locusStart.longitude = 0.0;
      locus1.geoEnd.latitude = 0.0;
      locus1.geoEnd.longitude = 0.0;
      locus1.geoStart.latitude = 0.0;
      locus1.geoStart.longitude = 0.0;
      locus2.lineType = 0;
      locus2.startDist = 0.0;
      locus2.endDist = 0.0;
      locus2.locusEnd.latitude = 0.0;
      locus2.locusEnd.longitude = 0.0;
      locus2.locusStart.latitude = 0.0;
      locus2.locusStart.longitude = 0.0;
      locus2.geoEnd.latitude = 0.0;
      locus2.geoEnd.longitude = 0.0;
      locus2.geoStart.latitude = 0.0;
      locus2.geoStart.longitude = 0.0;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,sLocus1GeoStartLat._M_dataplus._M_p,
                 sLocus1GeoStartLat._M_dataplus._M_p + sLocus1GeoStartLat._M_string_length);
      dVar9 = ParseLatitude(&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,sLocus1GeoStartLong._M_dataplus._M_p,
                 sLocus1GeoStartLong._M_dataplus._M_p + sLocus1GeoStartLong._M_string_length);
      dVar10 = ParseLongitude(&local_d0);
      locus1.geoStart.latitude = dVar9 * 0.017453292519943295;
      locus1.geoStart.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,sLocus1GeoEndLat._M_dataplus._M_p,
                 sLocus1GeoEndLat._M_dataplus._M_p + sLocus1GeoEndLat._M_string_length);
      dVar9 = ParseLatitude(&local_f0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,sLocus1GeoEndLong._M_dataplus._M_p,
                 sLocus1GeoEndLong._M_dataplus._M_p + sLocus1GeoEndLong._M_string_length);
      dVar10 = ParseLongitude(&local_110);
      locus1.geoEnd.latitude = dVar9 * 0.017453292519943295;
      locus1.geoEnd.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,sLocus1StartLat._M_dataplus._M_p,
                 sLocus1StartLat._M_dataplus._M_p + sLocus1StartLat._M_string_length);
      dVar9 = ParseLatitude(&local_130);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,sLocus1StartLong._M_dataplus._M_p,
                 sLocus1StartLong._M_dataplus._M_p + sLocus1StartLong._M_string_length);
      dVar10 = ParseLongitude(&local_150);
      locus1.locusStart.latitude = dVar9 * 0.017453292519943295;
      locus1.locusStart.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,sLocus1EndLat._M_dataplus._M_p,
                 sLocus1EndLat._M_dataplus._M_p + sLocus1EndLat._M_string_length);
      dVar9 = ParseLatitude(&local_170);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,sLocus1EndLong._M_dataplus._M_p,
                 sLocus1EndLong._M_dataplus._M_p + sLocus1EndLong._M_string_length);
      dVar10 = ParseLongitude(&local_190);
      locus1.locusEnd.latitude = dVar9 * 0.017453292519943295;
      locus1.locusEnd.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      dVar9 = atof(sLocus1StartDist._M_dataplus._M_p);
      locus1.startDist = dVar9 * 1852.0;
      dVar9 = atof(sLocus1EndDist._M_dataplus._M_p);
      locus1.endDist = dVar9 * 1852.0;
      locus1.lineType = 0;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,sLocus2GeoStartLat._M_dataplus._M_p,
                 sLocus2GeoStartLat._M_dataplus._M_p + sLocus2GeoStartLat._M_string_length);
      dVar9 = ParseLatitude(&local_1b0);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,sLocus2GeoStartLong._M_dataplus._M_p,
                 sLocus2GeoStartLong._M_dataplus._M_p + sLocus2GeoStartLong._M_string_length);
      dVar10 = ParseLongitude(&local_1d0);
      locus2.geoStart.latitude = dVar9 * 0.017453292519943295;
      locus2.geoStart.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,sLocus2GeoEndLat._M_dataplus._M_p,
                 sLocus2GeoEndLat._M_dataplus._M_p + sLocus2GeoEndLat._M_string_length);
      dVar9 = ParseLatitude(&local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,sLocus2GeoEndLong._M_dataplus._M_p,
                 sLocus2GeoEndLong._M_dataplus._M_p + sLocus2GeoEndLong._M_string_length);
      dVar10 = ParseLongitude(&local_210);
      locus2.geoEnd.latitude = dVar9 * 0.017453292519943295;
      locus2.geoEnd.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,sLocus2StartLat._M_dataplus._M_p,
                 sLocus2StartLat._M_dataplus._M_p + sLocus2StartLat._M_string_length);
      dVar9 = ParseLatitude(&local_230);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,sLocus2StartLong._M_dataplus._M_p,
                 sLocus2StartLong._M_dataplus._M_p + sLocus2StartLong._M_string_length);
      dVar10 = ParseLongitude(&local_250);
      locus2.locusStart.latitude = dVar9 * 0.017453292519943295;
      locus2.locusStart.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,sLocus2EndLat._M_dataplus._M_p,
                 sLocus2EndLat._M_dataplus._M_p + sLocus2EndLat._M_string_length);
      dVar9 = ParseLatitude(&local_270);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,sLocus2EndLong._M_dataplus._M_p,
                 sLocus2EndLong._M_dataplus._M_p + sLocus2EndLong._M_string_length);
      dVar10 = ParseLongitude(&local_290);
      locus2.locusEnd.latitude = dVar9 * 0.017453292519943295;
      locus2.locusEnd.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      dVar9 = atof(sLocus2StartDist._M_dataplus._M_p);
      locus2.startDist = dVar9 * 1852.0;
      dVar9 = atof(sLocus2EndDist._M_dataplus._M_p);
      locus2.endDist = dVar9 * 1852.0;
      locus2.lineType = 0;
      intersection.latitude = 0.0;
      intersection.longitude = 0.0;
      iVar5 = GeoCalcs::LocusIntersect(&locus1,&locus2,&intersection,1e-09,5e-16);
      if (iVar5 != 0) {
        sPtIntLon._M_dataplus._M_p = (pointer)(intersection.latitude * 57.29577951308232);
        ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
        local_610 = intersection.longitude * 57.29577951308232;
        ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,&local_610);
        sVar3 = sPtIntLat._M_string_length;
        sVar2 = sIntersection1Lat._M_string_length;
        sVar7 = sPtIntLat._M_string_length;
        if (sIntersection1Lat._M_string_length < sPtIntLat._M_string_length) {
          sVar7 = sIntersection1Lat._M_string_length;
        }
        bVar8 = true;
        bVar4 = true;
        if (sVar7 != 0) {
          iVar5 = bcmp(sPtIntLat._M_dataplus._M_p,sIntersection1Lat._M_dataplus._M_p,sVar7);
          bVar4 = iVar5 == 0;
        }
        if (!(bool)(bVar4 & sVar3 == sVar2)) {
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b0,sIntersection1Lat._M_dataplus._M_p,
                     sIntersection1Lat._M_dataplus._M_p + sVar2);
          dVar9 = ParseLatitude(&local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p);
          }
          dVar11 = ABS(dVar9 * 0.017453292519943295);
          dVar10 = ABS(intersection.latitude);
          if (dVar11 <= ABS(intersection.latitude)) {
            dVar10 = dVar11;
          }
          if (ABS(dVar9 * 0.017453292519943295 - intersection.latitude) <= dVar10 * 1e-10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," within rounding tolerance of 1e-10: Intersect 1 Latitude: ",0x3b);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sIntersection1Lat._M_dataplus._M_p,
                                sIntersection1Lat._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," calced: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," failed: Expected Intersect 1 latitude: ",0x28);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sIntersection1Lat._M_dataplus._M_p,
                                sIntersection1Lat._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  calced: ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
            bVar8 = false;
          }
        }
        sVar3 = sPtIntLon._M_string_length;
        sVar2 = sIntersection1Long._M_string_length;
        sVar7 = sPtIntLon._M_string_length;
        if (sIntersection1Long._M_string_length < sPtIntLon._M_string_length) {
          sVar7 = sIntersection1Long._M_string_length;
        }
        if (sVar7 == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp(sPtIntLon._M_dataplus._M_p,sIntersection1Long._M_dataplus._M_p,sVar7);
          bVar4 = iVar5 == 0;
        }
        if (!(bool)(bVar4 & sVar3 == sVar2)) {
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,sIntersection1Long._M_dataplus._M_p,
                     sIntersection1Long._M_dataplus._M_p + sVar2);
          dVar9 = ParseLongitude(&local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p);
          }
          dVar11 = ABS(dVar9 * 0.017453292519943295);
          dVar10 = ABS(intersection.longitude);
          if (dVar11 <= ABS(intersection.longitude)) {
            dVar10 = dVar11;
          }
          if (ABS(dVar9 * 0.017453292519943295 - intersection.longitude) <= dVar10 * 1e-10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," within rounding tolerance of 1e-10: Intersect 1 Longitude: ",0x3c);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sIntersection1Long._M_dataplus._M_p,
                                sIntersection1Long._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," calced: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," failed: Expected Intersect 1 longitude: ",0x29);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sIntersection1Long._M_dataplus._M_p,
                                sIntersection1Long._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  calced: ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
            bVar8 = false;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sPtIntLon._M_dataplus._M_p != &sPtIntLon.field_2) {
          operator_delete(sPtIntLon._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sPtIntLat._M_dataplus._M_p != &sPtIntLat.field_2) {
          operator_delete(sPtIntLat._M_dataplus._M_p);
        }
        goto LAB_001444ad;
      }
      iVar5 = std::__cxx11::string::compare((char *)&sIntersection1Lat);
      if (iVar5 == 0) {
        bVar8 = true;
        goto LAB_001444ad;
      }
      sPtIntLon._M_dataplus._M_p = (pointer)(intersection.latitude * 57.29577951308232);
      ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
      local_610 = intersection.longitude * 57.29577951308232;
      ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,&local_610);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,sTestId._M_dataplus._M_p,sTestId._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"failed: Expected solution of: ",0x1e);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,sIntersection1Lat._M_dataplus._M_p,
                          sIntersection1Lat._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,sIntersection1Long._M_dataplus._M_p,
                          sIntersection1Long._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," but none was found",0x13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sPtIntLon._M_dataplus._M_p != &sPtIntLon.field_2) {
        operator_delete(sPtIntLon._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sPtIntLat._M_dataplus._M_p != &sPtIntLat.field_2) {
        operator_delete(sPtIntLat._M_dataplus._M_p);
      }
    }
  }
  bVar8 = false;
LAB_001444ad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sTestId._M_dataplus._M_p != &sTestId.field_2) {
    operator_delete(sTestId._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sIntersection1Long._M_dataplus._M_p != &sIntersection1Long.field_2) {
    operator_delete(sIntersection1Long._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sIntersection1Lat._M_dataplus._M_p != &sIntersection1Lat.field_2) {
    operator_delete(sIntersection1Lat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2EndDist._M_dataplus._M_p != &sLocus2EndDist.field_2) {
    operator_delete(sLocus2EndDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2StartDist._M_dataplus._M_p != &sLocus2StartDist.field_2) {
    operator_delete(sLocus2StartDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2EndLong._M_dataplus._M_p != &sLocus2EndLong.field_2) {
    operator_delete(sLocus2EndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2EndLat._M_dataplus._M_p != &sLocus2EndLat.field_2) {
    operator_delete(sLocus2EndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2StartLong._M_dataplus._M_p != &sLocus2StartLong.field_2) {
    operator_delete(sLocus2StartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2StartLat._M_dataplus._M_p != &sLocus2StartLat.field_2) {
    operator_delete(sLocus2StartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2GeoEndLong._M_dataplus._M_p != &sLocus2GeoEndLong.field_2) {
    operator_delete(sLocus2GeoEndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2GeoEndLat._M_dataplus._M_p != &sLocus2GeoEndLat.field_2) {
    operator_delete(sLocus2GeoEndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2GeoStartLong._M_dataplus._M_p != &sLocus2GeoStartLong.field_2) {
    operator_delete(sLocus2GeoStartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2GeoStartLat._M_dataplus._M_p != &sLocus2GeoStartLat.field_2) {
    operator_delete(sLocus2GeoStartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1EndDist._M_dataplus._M_p != &sLocus1EndDist.field_2) {
    operator_delete(sLocus1EndDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1StartDist._M_dataplus._M_p != &sLocus1StartDist.field_2) {
    operator_delete(sLocus1StartDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1EndLong._M_dataplus._M_p != &sLocus1EndLong.field_2) {
    operator_delete(sLocus1EndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1EndLat._M_dataplus._M_p != &sLocus1EndLat.field_2) {
    operator_delete(sLocus1EndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1StartLong._M_dataplus._M_p != &sLocus1StartLong.field_2) {
    operator_delete(sLocus1StartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1StartLat._M_dataplus._M_p != &sLocus1StartLat.field_2) {
    operator_delete(sLocus1StartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1GeoEndLong._M_dataplus._M_p != &sLocus1GeoEndLong.field_2) {
    operator_delete(sLocus1GeoEndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1GeoEndLat._M_dataplus._M_p != &sLocus1GeoEndLat.field_2) {
    operator_delete(sLocus1GeoEndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1GeoStartLong._M_dataplus._M_p != &sLocus1GeoStartLong.field_2) {
    operator_delete(sLocus1GeoStartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1GeoStartLat._M_dataplus._M_p != &sLocus1GeoStartLat.field_2) {
    operator_delete(sLocus1GeoStartLat._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool ParseLocusIntersect(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;

    string sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat, sLocus1GeoEndLong;
    string sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong;
    string sLocus1StartDist, sLocus1EndDist;

    string sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong;
    string sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong;
    string sLocus2StartDist, sLocus2EndDist;

    string sIntersection1Lat, sIntersection1Long;
    string sTestId;

    if (!ParseLocusIntersect1(sLine1, sTestId, sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat,
                              sLocus1GeoEndLong,
                              sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong, sLocus1StartDist,
                              sLocus1EndDist))
        return false;

    if (!ParseLocusIntersect2(sLine2, sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong,
                              sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong, sLocus2StartDist,
                              sLocus2EndDist))
        return false;

    if (!ParseLocusIntersect3(sLine3, sIntersection1Lat, sIntersection1Long))
        return false;

    Locus locus1, locus2;
    locus1.geoStart.Set(Deg2Rad(ParseLatitude(sLocus1GeoStartLat)), Deg2Rad(ParseLongitude(sLocus1GeoStartLong)));
    locus1.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus1GeoEndLat)), Deg2Rad(ParseLongitude(sLocus1GeoEndLong)));
    locus1.locusStart.Set(Deg2Rad(ParseLatitude(sLocus1StartLat)), Deg2Rad(ParseLongitude(sLocus1StartLong)));
    locus1.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus1EndLat)), Deg2Rad(ParseLongitude(sLocus1EndLong)));
    locus1.startDist = NmToMeters(atof(sLocus1StartDist.c_str()));
    locus1.endDist = NmToMeters(atof(sLocus1EndDist.c_str()));
    locus1.lineType = 0;

    locus2.geoStart.Set(Deg2Rad(ParseLatitude(sLocus2GeoStartLat)), Deg2Rad(ParseLongitude(sLocus2GeoStartLong)));
    locus2.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus2GeoEndLat)), Deg2Rad(ParseLongitude(sLocus2GeoEndLong)));
    locus2.locusStart.Set(Deg2Rad(ParseLatitude(sLocus2StartLat)), Deg2Rad(ParseLongitude(sLocus2StartLong)));
    locus2.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus2EndLat)), Deg2Rad(ParseLongitude(sLocus2EndLong)));
    locus2.startDist = NmToMeters(atof(sLocus2StartDist.c_str()));
    locus2.endDist = NmToMeters(atof(sLocus2EndDist.c_str()));
    locus2.lineType = 0;

    LLPoint intersection;

    int nVal = LocusIntersect(locus1, locus2, intersection, kTol, kEps);

    if (nVal == 0)
    {
        if (sIntersection1Lat.compare("N/A") != 0)
        {
            string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
            string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
            cout << "\n" << sTestId << "failed: Expected solution of: " << sIntersection1Lat << " " <<
            sIntersection1Long << " but none was found";
            bPassed = false;
        }
    }
    else
    {
        string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
        string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
        if (sPtIntLat.compare(sIntersection1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sIntersection1Lat));
            if (IsApprox(dLat, intersection.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect 1 Latitude: " <<
                sIntersection1Lat << " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Intersect 1 latitude: " << sIntersection1Lat <<
                "  calced: " << sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sIntersection1Long) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sIntersection1Long));
            if (IsApprox(dLon, intersection.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect 1 Longitude: " <<
                sIntersection1Long << " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Intersect 1 longitude: " << sIntersection1Long <<
                "  calced: " << sPtIntLon;
                bPassed = false;
            }
        }
    }
    return bPassed;
}